

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O2

int conf_parse_file(char *file,proxy_conf *conf,log_handle *log)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  byte *__ptr;
  long lVar5;
  char **ppcVar6;
  ulong uVar7;
  char *pcVar8;
  int *piVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  byte *__s1;
  size_t __size;
  ulong uVar17;
  byte *__src;
  long lVar18;
  size_t sVar19;
  bool bVar20;
  undefined1 local_6a [2];
  log_handle *local_68;
  uint local_5c;
  FILE *local_58;
  size_t local_50;
  ulong local_48;
  uint16_t *local_40;
  uint32_t *local_38;
  
  local_68 = log;
  log_printf(log,LOG_LEVEL_DEBUG,"Loading proxy config from \'%s\'\n",file);
  local_58 = fopen(file,"r");
  if (local_58 == (FILE *)0x0) {
    piVar9 = __errno_location();
    return -*piVar9;
  }
  local_38 = &conf->connection_timeout;
  local_40 = &conf->port;
LAB_001028e8:
  __ptr = (byte *)malloc(0x80);
  if (__ptr != (byte *)0x0) {
    uVar17 = 0x80;
    uVar13 = 0;
    do {
      iVar3 = fgetc(local_58);
      uVar15 = uVar13;
      if (iVar3 == -1) break;
      uVar15 = uVar13 + 1;
      pbVar12 = __ptr;
      if (uVar17 <= uVar15) {
        uVar17 = uVar17 + 0x80;
        pbVar12 = (byte *)realloc(__ptr,uVar17);
        if (pbVar12 == (byte *)0x0) goto LAB_00103041;
      }
      __ptr = pbVar12;
      __ptr[uVar13] = (byte)iVar3;
      uVar13 = uVar15;
    } while (iVar3 != 10);
    __ptr[uVar15] = 0;
    if ((int)uVar15 < 1) goto LAB_00103041;
    pbVar12 = __ptr + -1;
    pbVar14 = __ptr + 2;
    __s1 = __ptr;
    __src = __ptr;
    while( true ) {
      __src = __src + 1;
      uVar13 = (ulong)*__s1;
      if (0x3d < uVar13) break;
      if ((0x100002600U >> (uVar13 & 0x3f) & 1) == 0) {
        if ((0x2000000800000001U >> (uVar13 & 0x3f) & 1) != 0) goto LAB_001029ad;
        break;
      }
      __s1 = __s1 + 1;
      pbVar12 = pbVar12 + 1;
      pbVar14 = pbVar14 + 1;
    }
    lVar5 = 0;
    pbVar10 = __s1;
    while ((char)uVar13 != '\0') {
      if ((int)uVar13 == 0x3d) goto LAB_001029ef;
      lVar5 = lVar5 + 1;
      bVar1 = *__src;
      __src = __src + 1;
      pbVar12 = pbVar12 + 1;
      pbVar10 = pbVar10 + 1;
      pbVar14 = pbVar14 + 1;
      uVar13 = (ulong)bVar1;
    }
LAB_001029ad:
    iVar3 = 0;
    goto LAB_001029af;
  }
  __ptr = (byte *)0x0;
LAB_00103041:
  free(__ptr);
  iVar3 = 0;
  goto LAB_0010304b;
LAB_001029ef:
  for (; (lVar5 != 0 && ((*pbVar12 == 0x20 || (*pbVar12 == 9)))); pbVar12 = pbVar12 + -1) {
    lVar5 = lVar5 + -1;
  }
  for (; (*__src == 9 || (*__src == 0x20)); __src = __src + 1) {
    pbVar10 = pbVar10 + 1;
    pbVar14 = pbVar14 + 1;
  }
  uVar13 = 0;
  sVar19 = 1;
  lVar2 = -1;
  do {
    lVar18 = lVar2;
    __size = sVar19;
    uVar17 = uVar13;
    pbVar12 = pbVar10;
    pbVar10 = pbVar12 + 1;
    uVar13 = uVar17 + 1;
    sVar19 = __size + 1;
    lVar2 = lVar18 + 1;
  } while (__src[lVar18 + 1] != 0);
  while (((__size != 1 && ((ulong)*pbVar12 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))) {
    __size = __size - 1;
    pbVar12 = pbVar12 + -1;
    lVar18 = lVar18 + -1;
    uVar17 = uVar17 - 1;
  }
  sVar19 = __size - 1;
  iVar3 = 0;
  switch(lVar5) {
  case 4:
    iVar4 = strncmp((char *)__s1,"Port",4);
    iVar3 = 0;
    if (iVar4 != 0) goto LAB_001029af;
    iVar3 = 0;
    iVar4 = __isoc99_sscanf(__src,"%hu%1s",local_40,local_6a);
    if (iVar4 == 1) goto LAB_001029af;
    pcVar8 = "Invalid configuration value for \'Port\': \'%.*s\'\n";
    goto LAB_00102c3f;
  case 5:
  case 6:
  case 7:
  case 9:
  case 10:
  case 0xc:
  case 0xe:
  case 0x12:
    break;
  case 8:
    iVar4 = strncmp((char *)__s1,"Password",8);
    if (iVar4 != 0) goto LAB_001029af;
    free(conf->password);
    pcVar8 = (char *)malloc(__size);
    conf->password = pcVar8;
    iVar3 = -0xc;
    if (pcVar8 == (char *)0x0) goto LAB_001029af;
    memcpy(pcVar8,__src,sVar19);
    pcVar8[__size - 1] = '\0';
    iVar4 = strcmp(pcVar8,"notset");
    iVar3 = 0;
    if (iVar4 != 0) goto LAB_001029af;
    free(pcVar8);
    conf->password = (char *)0x0;
    log_printf(local_68,LOG_LEVEL_ERROR,"Error: Missing password\n");
    goto LAB_00102c49;
  case 0xb:
    iVar4 = strncmp((char *)__s1,"BindAddress",0xb);
    if (iVar4 != 0) goto LAB_001029af;
    free(conf->bind_addr);
    if (__size != 1) {
      pcVar8 = (char *)malloc(__size);
      conf->bind_addr = pcVar8;
      goto LAB_00102fbc;
    }
    conf->bind_addr = (char *)0x0;
    break;
  case 0xd:
    iVar4 = strncmp((char *)__s1,"PublicAddress",0xd);
    if (iVar4 != 0) goto LAB_001029af;
    free(conf->public_addr);
    if (__size != 1) {
      pcVar8 = (char *)malloc(__size);
      conf->public_addr = pcVar8;
      goto LAB_00102fbc;
    }
    conf->public_addr = (char *)0x0;
    break;
  case 0xf:
    iVar4 = strncmp((char *)__s1,"CallsignsDenied",0xf);
    if (iVar4 != 0) goto LAB_001029af;
    free(conf->calls_denied);
    if (__size != 1) {
      pcVar8 = (char *)malloc(__size);
      conf->calls_denied = pcVar8;
      goto LAB_00102fbc;
    }
    conf->calls_denied = (char *)0x0;
    break;
  case 0x10:
    iVar4 = strncmp((char *)__s1,"CallsignsAllowed",0x10);
    if (iVar4 == 0) {
      free(conf->calls_allowed);
      if (__size == 1) {
        conf->calls_allowed = (char *)0x0;
      }
      else {
        pcVar8 = (char *)malloc(__size);
        conf->calls_allowed = pcVar8;
LAB_00102fbc:
        iVar3 = -0xc;
        if (pcVar8 == (char *)0x0) goto LAB_001029af;
        memcpy(pcVar8,__src,sVar19);
        pcVar8[__size - 1] = '\0';
      }
    }
    else {
      iVar4 = strncmp((char *)__s1,"RegistrationName",0x10);
      if (iVar4 != 0) goto LAB_001029af;
      free(conf->reg_name);
      if (__size != 1) {
        pcVar8 = (char *)malloc(__size);
        conf->reg_name = pcVar8;
        goto LAB_00102fbc;
      }
      conf->reg_name = (char *)0x0;
    }
    break;
  case 0x11:
    iVar4 = strncmp((char *)__s1,"ConnectionTimeout",0x11);
    iVar3 = 0;
    if (iVar4 != 0) goto LAB_001029af;
    iVar3 = 0;
    iVar4 = __isoc99_sscanf(__src,"%u%1s",local_38,local_6a);
    if (iVar4 == 1) goto LAB_001029af;
    pcVar8 = "Invalid configuration value for \'ConnectionTimeout\': \'%.*s\'\n";
LAB_00102c3f:
    log_printf(local_68,LOG_LEVEL_ERROR,pcVar8,(ulong)((int)__size - 1),__src);
LAB_00102c49:
    iVar3 = -0x16;
    goto LAB_001029af;
  case 0x13:
    iVar4 = strncmp((char *)__s1,"ExternalBindAddress",0x13);
    if (iVar4 == 0) {
      free(conf->bind_addr_ext);
      if (__size != 1) {
        pcVar8 = (char *)malloc(__size);
        conf->bind_addr_ext = pcVar8;
        goto LAB_00102fbc;
      }
      conf->bind_addr_ext = (char *)0x0;
    }
    else {
      iVar4 = strncmp((char *)__s1,"RegistrationComment",0x13);
      if (iVar4 != 0) goto LAB_001029af;
      free(conf->reg_comment);
      if (__size != 1) {
        pcVar8 = (char *)malloc(__size);
        conf->reg_comment = pcVar8;
        goto LAB_00102fbc;
      }
      conf->reg_comment = (char *)0x0;
    }
    break;
  default:
    if ((lVar5 == 0x1f) &&
       (local_50 = sVar19, iVar3 = strncmp((char *)__s1,"AdditionalExternalBindAddresses",0x1f),
       iVar3 == 0)) {
      free(conf->bind_addr_ext_add);
      if (__size != 1) {
        while (bVar20 = lVar18 != 0, lVar18 = lVar18 + -1, bVar20) {
          if (*pbVar14 == 0x2c) {
            conf->bind_addr_ext_add_len = conf->bind_addr_ext_add_len + 1;
          }
          pbVar14 = pbVar14 + 1;
        }
        uVar16 = *(int *)&conf->bind_addr_ext_add_len + 1;
        conf->bind_addr_ext_add_len = (uint16_t)uVar16;
        ppcVar6 = (char **)calloc((ulong)(uVar16 & 0xffff),8);
        conf->bind_addr_ext_add = ppcVar6;
        iVar3 = -0xc;
        if (ppcVar6 != (char **)0x0) {
          uVar13 = 0;
          uVar15 = 0;
LAB_00102eee:
          if (uVar13 < (uVar16 & 0xffff)) {
            sVar19 = local_50;
            if (local_50 < uVar15) {
              sVar19 = uVar15;
            }
            uVar11 = uVar15;
            uVar7 = uVar17;
            if (uVar17 < uVar15) {
              uVar7 = uVar15;
            }
            for (; (local_48 = sVar19, uVar7 != uVar11 && (local_48 = uVar11, __src[uVar11] != 0x2c)
                   ); uVar11 = uVar11 + 1) {
            }
            sVar19 = local_48 - uVar15;
            local_5c = uVar16;
            pcVar8 = (char *)malloc(sVar19 + 1);
            conf->bind_addr_ext_add[uVar13] = pcVar8;
            ppcVar6 = conf->bind_addr_ext_add;
            if (ppcVar6[uVar13] != (char *)0x0) goto code_r0x00102f64;
            uVar16 = local_5c;
            for (uVar13 = 0; uVar13 < (uVar16 & 0xffff); uVar13 = uVar13 + 1) {
              free(ppcVar6[uVar13]);
              uVar16 = (uint)conf->bind_addr_ext_add_len;
              ppcVar6 = conf->bind_addr_ext_add;
            }
            free(ppcVar6);
            conf->bind_addr_ext_add = (char **)0x0;
            conf->bind_addr_ext_add_len = 0;
            iVar3 = -0xc;
            goto LAB_001029af;
          }
          break;
        }
        goto LAB_001029af;
      }
      conf->bind_addr_ext_add = (char **)0x0;
      conf->bind_addr_ext_add_len = 0;
    }
  }
  iVar3 = 0;
LAB_001029af:
  free(__ptr);
  if (iVar3 < 0) {
LAB_0010304b:
    fclose(local_58);
    return iVar3;
  }
  goto LAB_001028e8;
code_r0x00102f64:
  memcpy(ppcVar6[uVar13],__src + uVar15,sVar19);
  conf->bind_addr_ext_add[uVar13][sVar19] = '\0';
  uVar15 = local_48 + 1;
  uVar13 = uVar13 + 1;
  uVar16 = (uint)conf->bind_addr_ext_add_len;
  goto LAB_00102eee;
}

Assistant:

int conf_parse_file(const char *file, struct proxy_conf *conf,
		    struct log_handle *log)
{
	FILE *stream;
	int ret;

	log_printf(log, LOG_LEVEL_DEBUG, "Loading proxy config from '%s'\n", file);

	stream = fopen(file, "r");
	if (stream == NULL)
		return -errno;

	ret = conf_parse_stream(stream, conf, log);

	fclose(stream);

	return ret;
}